

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O1

uchar * __thiscall
QResourceFileEnginePrivate::map
          (QResourceFileEnginePrivate *this,qint64 offset,qint64 size,MemoryMapFlags flags)

{
  QAbstractFileEngine *this_00;
  QResourcePrivate *pQVar1;
  bool bVar2;
  qint64 qVar3;
  char *pcVar4;
  uchar *puVar5;
  long in_FS_OFFSET;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QAbstractFileEnginePrivate).q_ptr;
  pQVar1 = (this->resource).d_ptr.d;
  QResourcePrivate::ensureInitialized(pQVar1);
  qVar3 = QResourcePrivate::uncompressedSize(pQVar1);
  if (0 < size && -1 < offset) {
    pQVar1 = (this->resource).d_ptr.d;
    QResourcePrivate::ensureInitialized(pQVar1);
    if ((((pQVar1->related).d.size != 0) && (!SCARRY8(size,offset))) && (size + offset <= qVar3)) {
      pcVar4 = (this->uncompressed).d.ptr;
      bVar2 = QByteArray::isNull(&this->uncompressed);
      if (bVar2) {
        pQVar1 = (this->resource).d_ptr.d;
        QResourcePrivate::ensureInitialized(pQVar1);
        if (((uint)flags.super_QFlagsStorageHelper<QFileDevice::MemoryMapFlag,_4>.
                   super_QFlagsStorage<QFileDevice::MemoryMapFlag>.i & 1) == 0) {
          pcVar4 = (char *)pQVar1->data;
        }
        else {
          mapUncompressed(this);
          pcVar4 = (this->uncompressed).d.ptr;
          if ((uchar *)pcVar4 == (uchar *)0x0) {
            pcVar4 = "";
          }
        }
      }
      puVar5 = (uchar *)pcVar4 + offset;
      goto LAB_00255844;
    }
  }
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_58.d.size = 0;
  QAbstractFileEngine::setError(this_00,UnspecifiedError,&local_58);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  puVar5 = (uchar *)0x0;
LAB_00255844:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return puVar5;
  }
  __stack_chk_fail();
}

Assistant:

uchar *QResourceFileEnginePrivate::map(qint64 offset, qint64 size, QFile::MemoryMapFlags flags)
{
    Q_Q(QResourceFileEngine);
    Q_ASSERT_X(resource.compressionAlgorithm() == QResource::NoCompression
               || !uncompressed.isNull(), "QFile::map()",
               "open() should have uncompressed compressed resources");

    qint64 max = resource.uncompressedSize();
    qint64 end;
    if (offset < 0 || size <= 0 || !resource.isValid() ||
            qAddOverflow(offset, size, &end) || end > max) {
        q->setError(QFile::UnspecifiedError, QString());
        return nullptr;
    }

    const uchar *address = reinterpret_cast<const uchar *>(uncompressed.constBegin());
    if (!uncompressed.isNull())
        return const_cast<uchar *>(address) + offset;

    // resource was not compressed
    address = resource.data();
    if (flags & QFile::MapPrivateOption) {
        // We need to provide read-write memory
        mapUncompressed();
        address = reinterpret_cast<const uchar *>(uncompressed.constData());
    }

    return const_cast<uchar *>(address) + offset;
}